

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDuctSilencerType::IfcDuctSilencerType(IfcDuctSilencerType *this)

{
  IfcDuctSilencerType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcDuctSilencerType");
  Schema_2x3::IfcFlowTreatmentDeviceType::IfcFlowTreatmentDeviceType
            (&this->super_IfcFlowTreatmentDeviceType,&PTR_construction_vtable_24__00f512b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDuctSilencerType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDuctSilencerType,_1UL> *)
             &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
              field_0x1b0,&PTR_construction_vtable_24__00f51490);
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0xf51130;
  *(undefined8 *)&this->field_0x1e0 = 0xf51298;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0xf51158;
  (this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf51180;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0xf511a8;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xf511d0;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0xf511f8;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0xf51220;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0xf51248;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0xf51270;
  std::__cxx11::string::string((string *)&(this->super_IfcFlowTreatmentDeviceType).field_0x1c0);
  return;
}

Assistant:

IfcDuctSilencerType() : Object("IfcDuctSilencerType") {}